

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,char *fd_name,FmsFieldDescriptor *fd)

{
  ulong uVar1;
  int iVar2;
  FmsInt FVar3;
  FmsFieldDescriptor *ppFVar4;
  FmsFieldDescriptor str_copy_p;
  int iVar5;
  
  if (dc == (FmsDataCollection)0x0) {
    iVar5 = 1;
  }
  else if (fd == (FmsFieldDescriptor *)0x0) {
    iVar5 = 2;
  }
  else {
    uVar1 = dc->num_fds;
    FVar3 = NextPow2(uVar1 + 1);
    iVar5 = 3;
    if (uVar1 <= FVar3 >> 1) {
      ppFVar4 = (FmsFieldDescriptor *)realloc(dc->fds,FVar3 << 3);
      if (ppFVar4 == (FmsFieldDescriptor *)0x0) {
        return 3;
      }
      dc->fds = ppFVar4;
    }
    str_copy_p = (FmsFieldDescriptor)calloc(1,0x28);
    if (str_copy_p != (FmsFieldDescriptor)0x0) {
      iVar2 = FmsCopyString(fd_name,(char **)str_copy_p);
      if (iVar2 == 0) {
        dc->num_fds = uVar1 + 1;
        dc->fds[uVar1] = str_copy_p;
        *fd = str_copy_p;
        iVar5 = 0;
      }
      else {
        free(str_copy_p);
      }
    }
  }
  return iVar5;
}

Assistant:

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,
                                        const char *fd_name,
                                        FmsFieldDescriptor *fd) {
  if (!dc) { E_RETURN(1); }
  if (!fd) { E_RETURN(2); }
  const FmsInt num_fds = dc->num_fds;
  FmsFieldDescriptor *fds = dc->fds;
  // Reallocate dc->fds, if necessary
  const FmsInt nc = NextPow2(num_fds + 1);
  if (num_fds <= nc/2) {
    fds = realloc(fds, nc*sizeof(*fds));
    if (fds == NULL) { E_RETURN(3); }
    dc->fds = fds;
  }
  FmsFieldDescriptor new_fd;
  new_fd = calloc(1, sizeof(*new_fd));
  if (new_fd == NULL) { E_RETURN(3); }
  // On error, call free(new_fd)
  if (FmsCopyString(fd_name, &new_fd->name)) { free(new_fd); E_RETURN(3); }
  // Update the field descriptor
  dc->num_fds = num_fds + 1;
  dc->fds[num_fds] = new_fd;
  *fd = new_fd;
  return 0;
}